

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall
tst_RoleMaskProxyModel::testUseRoleMaskRecurse
          (tst_RoleMaskProxyModel *this,int magicNumber,QAbstractItemModel *baseModel,
          RoleMaskProxyModel *proxyModel,QModelIndexList *magicNumerIndexes,bool userRoleEditable,
          QModelIndex *srcParent,QModelIndex *prxParent)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool local_16a;
  bool local_169;
  QVariant local_168;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_98;
  undefined1 local_78 [8];
  QModelIndex proxyParent;
  QModelIndex baseParent;
  int local_40;
  int j;
  int i;
  int colCnt;
  int rowCnt;
  bool userRoleEditable_local;
  QModelIndexList *magicNumerIndexes_local;
  RoleMaskProxyModel *proxyModel_local;
  QAbstractItemModel *baseModel_local;
  int magicNumber_local;
  tst_RoleMaskProxyModel *this_local;
  
  iVar3 = (**(code **)(*(long *)baseModel + 0x78))(baseModel,srcParent);
  iVar4 = (**(code **)(*(long *)baseModel + 0x80))(baseModel,srcParent);
  local_40 = 0;
  do {
    if (iVar3 <= local_40) {
      return;
    }
    for (baseParent.m._4_4_ = 0; baseParent.m._4_4_ < iVar4;
        baseParent.m._4_4_ = baseParent.m._4_4_ + 1) {
      (**(code **)(*(long *)baseModel + 0x60))
                (&proxyParent.m,baseModel,local_40,baseParent.m._4_4_,srcParent);
      (**(code **)(*(long *)proxyModel + 0x60))
                (local_78,proxyModel,local_40,baseParent.m._4_4_,prxParent);
      bVar1 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                        ((QListSpecialMethodsBase<QModelIndex> *)magicNumerIndexes,
                         (QModelIndex *)&proxyParent.m);
      if (bVar1) {
        QModelIndex::data(&local_98,(QModelIndex *)local_78,0x100);
        iVar5 = QVariant::toInt((bool *)&local_98);
        bVar2 = QTest::qCompare(iVar5,magicNumber,"proxyParent.data(Qt::UserRole).toInt()",
                                "magicNumber",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x492);
        QVariant::~QVariant(&local_98);
        if (((bVar2 ^ 0xff) & 1) != 0) {
          return;
        }
        if (userRoleEditable) {
          QModelIndex::data(&local_c8,(QModelIndex *)&proxyParent.m,0x100);
          iVar5 = QVariant::toInt((bool *)&local_c8);
          bVar2 = QTest::qCompare(iVar5,~magicNumber,"baseParent.data(Qt::UserRole).toInt()",
                                  "~magicNumber",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x494);
          QVariant::~QVariant(&local_c8);
        }
        else {
          QModelIndex::data(&local_e8,(QModelIndex *)&proxyParent.m,0x100);
          iVar5 = QVariant::toInt((bool *)&local_e8);
          bVar2 = QTest::qVerify(iVar5 != magicNumber,
                                 "baseParent.data(Qt::UserRole).toInt() != magicNumber","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                 ,0x496);
          QVariant::~QVariant(&local_e8);
        }
      }
      else {
        QModelIndex::data(&local_108,(QModelIndex *)local_78,0x100);
        QModelIndex::data(&local_128,(QModelIndex *)&proxyParent.m,0x100);
        bVar2 = QTest::qCompare<QVariant,QVariant>
                          (&local_108,&local_128,"proxyParent.data(Qt::UserRole)",
                           "baseParent.data(Qt::UserRole)",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x498);
        QVariant::~QVariant(&local_128);
        QVariant::~QVariant(&local_108);
      }
      if (((bVar2 ^ 0xff) & 1) != 0) {
        return;
      }
      QModelIndex::data(&local_148,(QModelIndex *)local_78,0);
      QModelIndex::data(&local_168,(QModelIndex *)&proxyParent.m,0);
      bVar1 = QTest::qCompare<QVariant,QVariant>
                        (&local_148,&local_168,"proxyParent.data()","baseParent.data()",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x49a);
      QVariant::~QVariant(&local_168);
      QVariant::~QVariant(&local_148);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return;
      }
      local_169 = (bool)(**(code **)(*(long *)proxyModel + 0x88))(proxyModel,local_78);
      local_169 = (bool)(local_169 & 1);
      local_16a = (bool)(**(code **)(*(long *)baseModel + 0x88))(baseModel,&proxyParent.m);
      local_16a = (bool)(local_16a & 1);
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_169,&local_16a,"proxyModel->hasChildren(proxyParent)",
                         "baseModel->hasChildren(baseParent)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x49b);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return;
      }
      uVar6 = (**(code **)(*(long *)baseModel + 0x88))(baseModel,&proxyParent.m);
      if ((uVar6 & 1) != 0) {
        testUseRoleMaskRecurse
                  (this,magicNumber,baseModel,proxyModel,magicNumerIndexes,userRoleEditable,
                   (QModelIndex *)&proxyParent.m,(QModelIndex *)local_78);
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMaskRecurse(const int magicNumber, const QAbstractItemModel *const baseModel,
                                                    const RoleMaskProxyModel *const proxyModel, const QModelIndexList &magicNumerIndexes,
                                                    const bool userRoleEditable, const QModelIndex &srcParent, const QModelIndex &prxParent)
{
    const int rowCnt = baseModel->rowCount(srcParent);
    const int colCnt = baseModel->columnCount(srcParent);
    for (int i = 0; i < rowCnt; ++i) {
        for (int j = 0; j < colCnt; ++j) {
            const QModelIndex baseParent = baseModel->index(i, j, srcParent);
            const QModelIndex proxyParent = proxyModel->index(i, j, prxParent);
            if (magicNumerIndexes.contains(baseParent)) {
                QCOMPARE(proxyParent.data(Qt::UserRole).toInt(), magicNumber);
                if (userRoleEditable)
                    QCOMPARE(baseParent.data(Qt::UserRole).toInt(), ~magicNumber);
                else
                    QVERIFY(baseParent.data(Qt::UserRole).toInt() != magicNumber);
            } else {
                QCOMPARE(proxyParent.data(Qt::UserRole), baseParent.data(Qt::UserRole));
            }
            QCOMPARE(proxyParent.data(), baseParent.data());
            QCOMPARE(proxyModel->hasChildren(proxyParent), baseModel->hasChildren(baseParent));
            if (baseModel->hasChildren(baseParent))
                testUseRoleMaskRecurse(magicNumber, baseModel, proxyModel, magicNumerIndexes, userRoleEditable, baseParent, proxyParent);
        }
    }
}